

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecStr.h
# Opt level: O0

Vec_Str_t * Vec_StrDup(Vec_Str_t *pVec)

{
  Vec_Str_t *pVVar1;
  char *local_20;
  Vec_Str_t *p;
  Vec_Str_t *pVec_local;
  
  pVVar1 = (Vec_Str_t *)malloc(0x10);
  pVVar1->nSize = pVec->nSize;
  pVVar1->nCap = pVec->nCap;
  if (pVVar1->nCap == 0) {
    local_20 = (char *)0x0;
  }
  else {
    local_20 = (char *)malloc((long)pVVar1->nCap);
  }
  pVVar1->pArray = local_20;
  memcpy(pVVar1->pArray,pVec->pArray,(long)pVec->nSize);
  return pVVar1;
}

Assistant:

static inline Vec_Str_t * Vec_StrDup( Vec_Str_t * pVec )
{
    Vec_Str_t * p;
    p = ABC_ALLOC( Vec_Str_t, 1 );
    p->nSize  = pVec->nSize;
    p->nCap   = pVec->nCap;
    p->pArray = p->nCap? ABC_ALLOC( char, p->nCap ) : NULL;
    memcpy( p->pArray, pVec->pArray, sizeof(char) * pVec->nSize );
    return p;
}